

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_adds_a_w_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  float32 fVar8;
  
  lVar4 = (ulong)wd * 0x10;
  lVar6 = (ulong)ws * 0x10;
  lVar5 = (ulong)wt * 0x10;
  uVar1 = (env->active_fpu).fpr[ws].fs[0];
  uVar2 = (env->active_fpu).fpr[wt].fs[0];
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  uVar1 = -uVar2;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  fVar8 = uVar1 + uVar3;
  if (0x7fffffff - (ulong)uVar1 <= (ulong)uVar3) {
    fVar8 = 0x7fffffff;
  }
  if ((int)(uVar1 | uVar3) < 0) {
    fVar8 = 0x7fffffff;
  }
  (env->active_fpu).fpr[wd].fs[0] = fVar8;
  uVar1 = *(uint *)((long)(env->active_fpu).fpr + lVar6 + 4);
  uVar2 = *(uint *)((long)(env->active_fpu).fpr + lVar5 + 4);
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  uVar1 = -uVar2;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  iVar7 = uVar1 + uVar3;
  if (0x7fffffff - (ulong)uVar1 <= (ulong)uVar3) {
    iVar7 = 0x7fffffff;
  }
  if ((int)(uVar1 | uVar3) < 0) {
    iVar7 = 0x7fffffff;
  }
  *(int *)((long)(env->active_fpu).fpr + lVar4 + 4) = iVar7;
  uVar1 = *(uint *)((long)(env->active_fpu).fpr + lVar6 + 8);
  uVar2 = *(uint *)((long)(env->active_fpu).fpr + lVar5 + 8);
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  uVar1 = -uVar2;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  iVar7 = uVar1 + uVar3;
  if (0x7fffffff - (ulong)uVar1 <= (ulong)uVar3) {
    iVar7 = 0x7fffffff;
  }
  if ((int)(uVar1 | uVar3) < 0) {
    iVar7 = 0x7fffffff;
  }
  *(int *)((long)(env->active_fpu).fpr + lVar4 + 8) = iVar7;
  uVar1 = *(uint *)((long)(env->active_fpu).fpr + lVar6 + 0xc);
  uVar2 = *(uint *)((long)(env->active_fpu).fpr + lVar5 + 0xc);
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  uVar1 = -uVar2;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  iVar7 = uVar1 + uVar3;
  if (0x7fffffff - (ulong)uVar1 <= (ulong)uVar3) {
    iVar7 = 0x7fffffff;
  }
  if ((int)(uVar1 | uVar3) < 0) {
    iVar7 = 0x7fffffff;
  }
  *(int *)((long)(env->active_fpu).fpr + lVar4 + 0xc) = iVar7;
  return;
}

Assistant:

void helper_msa_adds_a_w(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_adds_a_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_adds_a_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_adds_a_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_adds_a_df(DF_WORD, pws->w[3],  pwt->w[3]);
}